

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_object_impl.hpp
# Opt level: O2

void __thiscall
asio::detail::io_object_impl<asio::detail::resolver_service<asio::ip::tcp>,_asio::any_io_executor>::
~io_object_impl(io_object_impl<asio::detail::resolver_service<asio::ip::tcp>,_asio::any_io_executor>
                *this)

{
  std::__shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>::reset
            (&(this->implementation_).super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>);
  execution::detail::any_executor_base::~any_executor_base((any_executor_base *)&this->executor_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->implementation_).super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

~io_object_impl()
  {
    service_->destroy(implementation_);
  }